

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcpuid_util.c
# Opt level: O0

void debug_print_lbits(int debuglevel,uint64_t mask)

{
  uint local_1c;
  int first;
  int i;
  uint64_t mask_local;
  int debuglevel_local;
  
  for (local_1c = 0; (int)local_1c < 0x40; local_1c = local_1c + 1) {
    if ((mask & 1L << ((byte)local_1c & 0x3f)) != 0) {
      debugf(debuglevel," + ");
      debugf(debuglevel,"LBIT(%d)",(ulong)local_1c);
    }
  }
  debugf(debuglevel,"\n");
  return;
}

Assistant:

void debug_print_lbits(int debuglevel, uint64_t mask)
{
	int i, first = 0;
	for (i = 0; i < 64; i++) if (mask & (((uint64_t) 1) << i)) {
		if (first) first = 0;
		else debugf(debuglevel, " + ");
		debugf(debuglevel, "LBIT(%d)", i);
	}
	debugf(debuglevel, "\n");
}